

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void gen_move_insn_before(gen_ctx_t gen_ctx,MIR_insn_t before,MIR_insn_t insn)

{
  bb_insn_t_conflict elem;
  bb_insn_t_conflict before_00;
  bb_insn_t_conflict before_bb_insn;
  bb_insn_t_conflict bb_insn;
  MIR_insn_t insn_local;
  MIR_insn_t before_local;
  gen_ctx_t gen_ctx_local;
  
  elem = (bb_insn_t_conflict)insn->data;
  before_00 = (bb_insn_t_conflict)before->data;
  DLIST_MIR_insn_t_remove(&((gen_ctx->curr_func_item->u).func)->insns,insn);
  MIR_insert_insn_before(gen_ctx->ctx,gen_ctx->curr_func_item,before,insn);
  DLIST_bb_insn_t_remove(&elem->bb->bb_insns,elem);
  DLIST_bb_insn_t_insert_before(&before_00->bb->bb_insns,before_00,elem);
  elem->bb = before_00->bb;
  return;
}

Assistant:

static void gen_move_insn_before (gen_ctx_t gen_ctx, MIR_insn_t before, MIR_insn_t insn) {
  bb_insn_t bb_insn = insn->data, before_bb_insn = before->data;

  DLIST_REMOVE (MIR_insn_t, curr_func_item->u.func->insns, insn);
  MIR_insert_insn_before (gen_ctx->ctx, curr_func_item, before, insn);
  DLIST_REMOVE (bb_insn_t, bb_insn->bb->bb_insns, bb_insn);
  DLIST_INSERT_BEFORE (bb_insn_t, before_bb_insn->bb->bb_insns, before_bb_insn, bb_insn);
  bb_insn->bb = before_bb_insn->bb;
}